

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

GLuint __thiscall
QOpenGL2PaintEngineExPrivate::bindTexture<ImageWithBindOptions>
          (QOpenGL2PaintEngineExPrivate *this,ImageWithBindOptions *imageWithOptions,
          bool *newTextureCreated)

{
  bool bVar1;
  BindResult BVar2;
  long in_RDX;
  QFlags<QOpenGLTextureCache::BindResultFlag> *in_RDI;
  long in_FS_OFFSET;
  QOpenGLContext *unaff_retaddr;
  QOpenGLTextureCache *in_stack_00000008;
  BindResult result;
  BindOptions in_stack_00000044;
  undefined4 in_stack_ffffffffffffffbc;
  BindResultFlag flag;
  undefined4 local_10;
  QImage *image;
  
  flag = (BindResultFlag)((uint)in_stack_ffffffffffffffbc >> 0x18);
  image = *(QImage **)(in_FS_OFFSET + 0x28);
  QPointer::operator_cast_to_QOpenGLContext_((QPointer<QOpenGLContext> *)0x15bbb7);
  QOpenGLTextureCache::cacheForContext((QOpenGLContext *)0x15bbbf);
  QPointer::operator_cast_to_QOpenGLContext_((QPointer<QOpenGLContext> *)0x15bbd5);
  BVar2 = QOpenGLTextureCache::bindTexture(in_stack_00000008,unaff_retaddr,image,in_stack_00000044);
  if (in_RDX != 0) {
    bVar1 = QFlags<QOpenGLTextureCache::BindResultFlag>::testFlag(in_RDI,flag);
    *(bool *)in_RDX = bVar1;
  }
  local_10 = BVar2.id;
  if (*(QImage **)(in_FS_OFFSET + 0x28) == image) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

GLuint QOpenGL2PaintEngineExPrivate::bindTexture(const ImageWithBindOptions &imageWithOptions, bool *newTextureCreated)
{
    QOpenGLTextureCache::BindResult result = QOpenGLTextureCache::cacheForContext(ctx)->bindTexture(ctx,
                                                                                                    imageWithOptions.image,
                                                                                                    imageWithOptions.options);
    if (newTextureCreated)
        *newTextureCreated = result.flags.testFlag(QOpenGLTextureCache::BindResultFlag::NewTexture);
    return result.id;
}